

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

string * __thiscall
cppcms::widgets::base_widget::id_abi_cxx11_(string *__return_storage_ptr__,base_widget *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->id_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->id_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string base_widget::id()
{
	return id_;
}